

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O3

void FACT_INTERNAL_OnBufferEnd(FAudioVoiceCallback *callback,void *pContext)

{
  code cVar1;
  uint uVar2;
  OnBufferEndFunc p_Var3;
  long *plVar4;
  long lVar5;
  code *pcVar6;
  code *pcVar7;
  bool bVar8;
  uint uVar9;
  uint8_t *puVar10;
  FAudioBufferWMA *pBufferWMA;
  int iVar11;
  uint uVar12;
  uint uVar13;
  FAudioSourceVoice *voice;
  uint uVar14;
  long lVar15;
  FAudioBufferWMA bufferWMA;
  ulong local_b8;
  undefined1 local_a8 [16];
  uint local_98;
  undefined4 local_94;
  undefined8 local_90;
  uint8_t *local_80;
  long local_78;
  code *local_70;
  FAudioVoiceCallback *local_68;
  undefined1 local_60 [4];
  FAudioBuffer local_5c;
  
  p_Var3 = callback[1].OnBufferEnd;
  plVar4 = *(long **)p_Var3;
  lVar15 = (ulong)((uint)*(ushort *)(p_Var3 + 0x10) * 0x18) + plVar4[7];
  if ((p_Var3[0x2a] == (_func_void_FAudioVoiceCallback_ptr_void_ptr)0x0) ||
     (*(int *)(lVar15 + 0x14) == 0)) {
LAB_0010f5be:
    iVar11 = *(int *)(lVar15 + 0xc);
  }
  else {
    uVar9 = *(int *)(lVar15 + 0x14) + *(int *)(lVar15 + 0x10);
    uVar13 = *(uint *)(lVar15 + 4);
    if ((uVar13 & 3) == 2) {
      uVar12 = uVar13 >> 0x17 & 0xff;
      iVar11 = (uVar13 >> 2 & 7) * (uVar12 + 0x16) * (uVar9 / (uVar12 * 2 + 0x20));
    }
    else {
      if ((uVar13 & 3) != 0) goto LAB_0010f5be;
      iVar11 = (uVar13 >> 2 & 7) * uVar9 << (byte)(uVar13 >> 0x1f);
    }
  }
  uVar12 = iVar11 + *(int *)(lVar15 + 8);
  uVar13 = *(uint *)(p_Var3 + 0x30);
  uVar9 = uVar12 - uVar13;
  if (uVar12 < uVar13 || uVar9 == 0) {
    return;
  }
  if (((byte)p_Var3[0x20] & 0x20) != 0) {
    return;
  }
  puVar10 = *(uint8_t **)(p_Var3 + 0x38);
  if (*(uint *)(p_Var3 + 0x2c) < uVar9) {
    uVar9 = *(uint *)(p_Var3 + 0x2c);
  }
  lVar5 = *plVar4;
  pcVar6 = *(code **)(lVar5 + 0x10);
  local_70 = *(code **)(lVar5 + 0x18);
  local_78 = plVar4[0xe];
  uVar2 = *(uint *)(plVar4 + 0xb);
  pcVar7 = *(code **)(lVar5 + 0xd8);
  local_94 = 0;
  local_90 = 0;
  local_a8._0_8_ = (uint32_t *)0x0;
  local_a8._8_8_ = 0;
  uVar14 = uVar9;
  local_80 = puVar10;
  local_68 = callback;
  local_5c.AudioBytes = uVar9;
  local_5c.pAudioData = puVar10;
  if (uVar2 == 0) {
LAB_0010f6a2:
    bVar8 = true;
    local_b8 = 0;
  }
  else {
    local_b8 = (ulong)uVar13 % (ulong)uVar2;
    iVar11 = (int)local_b8;
    uVar13 = uVar13 - iVar11;
    uVar14 = iVar11 + uVar9;
    if (uVar14 % uVar2 == 0) {
      if (iVar11 == 0) goto LAB_0010f6a2;
    }
    else {
      uVar14 = uVar14 + (uVar2 - uVar14 % uVar2);
    }
    puVar10 = (uint8_t *)plVar4[0xc];
    if (*(uint *)(plVar4 + 0xd) < uVar14) {
      *(uint *)(plVar4 + 0xd) = uVar14;
      puVar10 = (uint8_t *)(*pcVar7)(puVar10,uVar14);
      plVar4[0xc] = (long)puVar10;
    }
    bVar8 = false;
  }
  lVar5 = local_78;
  local_98 = uVar13;
  iVar11 = (*pcVar6)(local_78,puVar10,uVar14,0);
  if (iVar11 == 0) {
    while ((uint32_t *)local_a8._0_8_ == (uint32_t *)0x103) {
      FAudio_sleep(0);
    }
  }
  (*local_70)(lVar5,local_a8,local_60,1);
  if (!bVar8) {
    SDL_memcpy(local_80,local_b8 + plVar4[0xc],uVar9);
  }
  p_Var3 = local_68[1].OnBufferEnd;
  iVar11 = *(int *)(p_Var3 + 0x30);
  *(uint32_t *)(p_Var3 + 0x30) = iVar11 + local_5c.AudioBytes;
  local_5c.Flags = 0;
  if (uVar12 <= iVar11 + local_5c.AudioBytes) {
    cVar1 = p_Var3[0x2a];
    if (cVar1 == (code)0x0) {
      local_5c.Flags = 0x40;
    }
    else {
      if (cVar1 != (code)0xff) {
        p_Var3[0x2a] = (_func_void_FAudioVoiceCallback_ptr_void_ptr)((char)cVar1 + -1);
      }
      iVar11 = *(int *)(lVar15 + 8);
      *(int *)(p_Var3 + 0x30) = iVar11;
      uVar13 = *(uint *)(lVar15 + 4);
      if ((uVar13 & 3) == 2) {
        uVar9 = uVar13 >> 0x17 & 0xff;
        *(uint *)(p_Var3 + 0x30) =
             (uVar13 >> 2 & 7) * (uVar9 + 0x16) * (*(uint *)(lVar15 + 0x10) / (uVar9 * 2 + 0x20)) +
             iVar11;
      }
      else if ((uVar13 & 3) == 0) {
        *(uint *)(p_Var3 + 0x30) =
             ((uVar13 >> 2 & 7) * *(int *)(lVar15 + 0x10) << (byte)(uVar13 >> 0x1f)) + iVar11;
      }
    }
  }
  local_5c.LoopCount = 0;
  local_5c.pContext = (void *)0x0;
  local_5c.PlayBegin = 0;
  local_5c.PlayLength = 0;
  local_5c.LoopBegin = 0;
  local_5c.LoopLength = 0;
  if ((~*(uint *)(lVar15 + 4) & 3) == 0) {
    local_a8._0_8_ =
         *(long *)(*(long *)(*(long *)p_Var3 + 0x48) + 8 + (ulong)*(ushort *)(p_Var3 + 0x10) * 0x10)
    ;
    pBufferWMA = (FAudioBufferWMA *)local_a8;
    local_a8._8_4_ =
         *(undefined4 *)
          (*(long *)(*(long *)p_Var3 + 0x48) + (ulong)*(ushort *)(p_Var3 + 0x10) * 0x10);
    voice = *(FAudioSourceVoice **)(p_Var3 + 0x48);
  }
  else {
    voice = *(FAudioSourceVoice **)(p_Var3 + 0x48);
    pBufferWMA = (FAudioBufferWMA *)0x0;
  }
  FAudioSourceVoice_SubmitSourceBuffer(voice,&local_5c,pBufferWMA);
  return;
}

Assistant:

void FACT_INTERNAL_OnBufferEnd(FAudioVoiceCallback *callback, void* pContext)
{
	FAudioBuffer buffer;
	FAudioBufferWMA bufferWMA;
	FACTWaveCallback *c = (FACTWaveCallback*) callback;
	FACTWaveBankEntry *entry;
	uint32_t end, left, length;

	entry = &c->wave->parentBank->entries[c->wave->index];

	/* Calculate total bytes left in this wave iteration */
	if (c->wave->loopCount > 0 && entry->LoopRegion.dwTotalSamples > 0)
	{
		length = entry->LoopRegion.dwStartSample + entry->LoopRegion.dwTotalSamples;
		if (entry->Format.wFormatTag == 0x0)
		{
			length = (
				length *
				entry->Format.nChannels *
				(1 << entry->Format.wBitsPerSample)
			);
		}
		else if (entry->Format.wFormatTag == 0x2)
		{
			length = (
				length /
				/* wSamplesPerBlock */
				((entry->Format.wBlockAlign + 16) * 2) *
				/* nBlockAlign */
				((entry->Format.wBlockAlign + 22) * entry->Format.nChannels)
			);
		}
		else
		{
			length = entry->PlayRegion.dwLength;
		}
	}
	else
	{
		length = entry->PlayRegion.dwLength;
	}
	end = entry->PlayRegion.dwOffset + length;
	left = length - (c->wave->streamOffset - entry->PlayRegion.dwOffset);

	/* Don't bother if we're EOS or the Wave has stopped */
	if (	(c->wave->streamOffset >= end) ||
		(c->wave->state & FACT_STATE_STOPPED)	)
	{
		return;
	}

	/* Assign buffer memory */
	buffer.pAudioData = c->wave->streamCache;
	buffer.AudioBytes = FAudio_min(
		c->wave->streamSize,
		left
	);

	/* Read! */
	FACT_INTERNAL_ReadFile(
		c->wave->parentBank->parentEngine->pReadFile,
		c->wave->parentBank->parentEngine->pGetOverlappedResult,
		c->wave->parentBank->io,
		c->wave->streamOffset,
		c->wave->parentBank->packetSize,
		&c->wave->parentBank->packetBuffer,
		&c->wave->parentBank->packetBufferLen,
		c->wave->parentBank->parentEngine->pRealloc,
		c->wave->streamCache,
		buffer.AudioBytes
	);
	c->wave->streamOffset += buffer.AudioBytes;

	/* Last buffer in the stream? */
	buffer.Flags = 0;
	if (c->wave->streamOffset >= end)
	{
		/* Loop if applicable */
		if (c->wave->loopCount > 0)
		{
			if (c->wave->loopCount != 255)
			{
				c->wave->loopCount -= 1;
			}
			c->wave->streamOffset = entry->PlayRegion.dwOffset;

			/* Loop start */
			if (entry->Format.wFormatTag == 0x0)
			{
				c->wave->streamOffset += (
					entry->LoopRegion.dwStartSample *
					entry->Format.nChannels *
					(1 << entry->Format.wBitsPerSample)
				);
			}
			else if (entry->Format.wFormatTag == 0x2)
			{
				c->wave->streamOffset += (
					entry->LoopRegion.dwStartSample /
					/* wSamplesPerBlock */
					((entry->Format.wBlockAlign + 16) * 2) *
					/* nBlockAlign */
					((entry->Format.wBlockAlign + 22) * entry->Format.nChannels)
				);
			}
		}
		else
		{
			buffer.Flags = FAUDIO_END_OF_STREAM;
		}
	}

	/* Unused properties */
	buffer.PlayBegin = 0;
	buffer.PlayLength = 0;
	buffer.LoopBegin = 0;
	buffer.LoopLength = 0;
	buffer.LoopCount = 0;
	buffer.pContext = NULL;

	/* Submit, finally. */
	if (entry->Format.wFormatTag == 0x3)
	{
		bufferWMA.pDecodedPacketCumulativeBytes =
			c->wave->parentBank->seekTables[c->wave->index].entries;
		bufferWMA.PacketCount =
			c->wave->parentBank->seekTables[c->wave->index].entryCount;
		FAudioSourceVoice_SubmitSourceBuffer(
			c->wave->voice,
			&buffer,
			&bufferWMA
		);
	}
	else
	{
		FAudioSourceVoice_SubmitSourceBuffer(
			c->wave->voice,
			&buffer,
			NULL
		);
	}
}